

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void instrFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  int local_44;
  int isText;
  int N;
  int typeNeedle;
  int typeHaystack;
  int nNeedle;
  int nHaystack;
  uchar *zNeedle;
  uchar *zHaystack;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *context_local;
  
  local_44 = 1;
  iVar2 = sqlite3_value_type(*argv);
  iVar3 = sqlite3_value_type(argv[1]);
  if ((iVar2 != 5) && (iVar3 != 5)) {
    typeHaystack = sqlite3_value_bytes(*argv);
    iVar4 = sqlite3_value_bytes(argv[1]);
    if (0 < iVar4) {
      if ((iVar2 == 4) && (iVar3 == 4)) {
        zNeedle = (uchar *)sqlite3_value_blob(*argv);
        _nNeedle = (uchar *)sqlite3_value_blob(argv[1]);
        bVar1 = false;
      }
      else {
        zNeedle = sqlite3_value_text(*argv);
        _nNeedle = sqlite3_value_text(argv[1]);
        bVar1 = true;
      }
      if (_nNeedle == (uchar *)0x0) {
        return;
      }
      if ((typeHaystack != 0) && (zNeedle == (uchar *)0x0)) {
        return;
      }
      while( true ) {
        bVar5 = false;
        if (iVar4 <= typeHaystack) {
          iVar2 = memcmp(zNeedle,_nNeedle,(long)iVar4);
          bVar5 = iVar2 != 0;
        }
        if (!bVar5) break;
        local_44 = local_44 + 1;
        do {
          typeHaystack = typeHaystack + -1;
          zNeedle = zNeedle + 1;
          bVar5 = false;
          if (bVar1) {
            bVar5 = (*zNeedle & 0xc0) == 0x80;
          }
        } while (bVar5);
      }
      if (typeHaystack < iVar4) {
        local_44 = 0;
      }
    }
    sqlite3_result_int(context,local_44);
  }
  return;
}

Assistant:

static void instrFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const unsigned char *zHaystack;
  const unsigned char *zNeedle;
  int nHaystack;
  int nNeedle;
  int typeHaystack, typeNeedle;
  int N = 1;
  int isText;

  UNUSED_PARAMETER(argc);
  typeHaystack = sqlite3_value_type(argv[0]);
  typeNeedle = sqlite3_value_type(argv[1]);
  if( typeHaystack==SQLITE_NULL || typeNeedle==SQLITE_NULL ) return;
  nHaystack = sqlite3_value_bytes(argv[0]);
  nNeedle = sqlite3_value_bytes(argv[1]);
  if( nNeedle>0 ){
    if( typeHaystack==SQLITE_BLOB && typeNeedle==SQLITE_BLOB ){
      zHaystack = sqlite3_value_blob(argv[0]);
      zNeedle = sqlite3_value_blob(argv[1]);
      isText = 0;
    }else{
      zHaystack = sqlite3_value_text(argv[0]);
      zNeedle = sqlite3_value_text(argv[1]);
      isText = 1;
    }
    if( zNeedle==0 || (nHaystack && zHaystack==0) ) return;
    while( nNeedle<=nHaystack && memcmp(zHaystack, zNeedle, nNeedle)!=0 ){
      N++;
      do{
        nHaystack--;
        zHaystack++;
      }while( isText && (zHaystack[0]&0xc0)==0x80 );
    }
    if( nNeedle>nHaystack ) N = 0;
  }
  sqlite3_result_int(context, N);
}